

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O1

void __thiscall
ProblemFireFightingFactored::ConstructObservations(ProblemFireFightingFactored *this)

{
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  string descr;
  string whatObs;
  string name;
  stringstream ss;
  string local_228;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  ProblemFireFightingFactored *local_1e8;
  MADPComponentDiscreteObservations *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  if (*(long *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708 != 0) {
    local_1e0 = &(this->super_FactoredDecPOMDPDiscrete).
                 super_MultiAgentDecisionProcessDiscreteFactoredStates._m_O;
    uVar4 = 0;
    local_1e8 = this;
    do {
      uVar3 = 0;
      do {
        local_208 = &local_1f8;
        local_200 = 0;
        local_1f8 = '\0';
        pcVar2 = "Flames__";
        if ((uVar3 & 1) != 0) {
          pcVar2 = "NoFlames";
        }
        std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)0x0,(ulong)pcVar2);
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_208,local_200);
        std::__cxx11::stringbuf::str();
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
        std::__cxx11::stringbuf::str(local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Observation ",0xc);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," of agent ",10);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_208,local_200);
        std::__cxx11::stringbuf::str();
        MADPComponentDiscreteObservations::AddObservation
                  (local_1e0,(Index)uVar4,&local_1d8,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_208 != &local_1f8) {
          operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 == 1);
      uVar4 = (ulong)((Index)uVar4 + 1);
    } while (uVar4 < *(ulong *)&(local_1e8->super_FactoredDecPOMDPDiscrete).field_0x708);
  }
  return;
}

Assistant:

void ProblemFireFightingFactored::ConstructObservations()
{
    /// add observations:
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        size_t nrObservationsThisAgent = 2; //flames or no flames
//         _m_nrObservations.push_back(nrObservationsThisAgent);
//         _m_observationVecs.push_back( vector<ObservationDiscrete>() );
        for(Index obsI=0; obsI < nrObservationsThisAgent; obsI++)
        {

            string whatObs;
            switch(obsI){
            case(FLAMES):    whatObs = "Flames__";
                break;
            case(NOFLAMES):    whatObs = "NoFlames";
                break;
            }
            stringstream ss;
            //ss << "Ag" <<agentIndex << ":" << whatObs;
            ss << whatObs;
            string name = ss.str();
            ss.str("");
            ss << "Observation " << obsI << " of agent " << agentIndex << ": " << whatObs;
            string descr = ss.str();
//             ObservationDiscrete od_temp = ObservationDiscrete(obsI,name,descr);
//             _m_observationVecs[agentIndex].push_back( od_temp );
            AddObservation(agentIndex,name,descr);
        }
    }
}